

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O2

void sv_send_cb(uv_udp_send_t *req,int status)

{
  uv_udp_t *handle;
  char *pcVar1;
  undefined8 uStack_10;
  
  if (req == (uv_udp_send_t *)0x0) {
    pcVar1 = "req != NULL";
    uStack_10 = 0x69;
  }
  else if (status == 0) {
    handle = req->handle;
    if (handle == &client || handle == &server) {
      uv_close((uv_handle_t *)handle,close_cb);
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
    pcVar1 = "(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client";
    uStack_10 = 0x6b;
  }
  else {
    pcVar1 = "status == 0";
    uStack_10 = 0x6a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-and-recv.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  sv_send_cb_called++;

  if (sv_send_cb_called == 2)
    uv_close((uv_handle_t*) req->handle, close_cb);
}